

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> *
deqp::gles2::Performance::vectorLowestPercentage<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          vector<long,_std::allocator<long>_> *v,float factor)

{
  pointer plVar1;
  ulong uVar2;
  float fVar3;
  
  fVar3 = ceilf((float)(ulong)((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                     super__Vector_impl_data._M_start >> 3) * factor);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,v);
  std::
  __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  plVar1 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar2 = (long)plVar1 -
               (long)(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>).
                     _M_impl.super__Vector_impl_data._M_start; plVar1 = plVar1 + -1,
      (int)fVar3 < (int)(uVar2 >> 3); uVar2 = uVar2 - 8) {
    (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
    super__Vector_impl_data._M_finish = plVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<T> vectorLowestPercentage (const vector<T>& v, float factor)
{
	DE_ASSERT(0.0f < factor && factor <= 1.0f);

	int			targetSize	= (int)(deFloatCeil(factor*(float)v.size()));
	vector<T>	temp		= v;
	std::sort(temp.begin(), temp.end());

	while ((int)temp.size() > targetSize)
		temp.pop_back();

	return temp;
}